

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_ca99e8::InstanceBuilder::~InstanceBuilder(InstanceBuilder *this)

{
  pointer p;
  
  p = (this->path).super_SmallVectorBase<unsigned_int>.data_;
  if (p != (pointer)(this->path).super_SmallVectorBase<unsigned_int>.firstElement) {
    operator_delete(p);
  }
  boost::unordered::detail::foa::
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::delete_(*(Storage **)&(this->implicitNetNames).super_Storage.field_0x88,
            (table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
             *)&(this->implicitNetNames).field_0x90);
  return;
}

Assistant:

InstanceBuilder(const ASTContext& context, SmallVectorBase<const Symbol*>& implicitNets,
                    const HierarchyOverrideNode* parentOverrideNode,
                    std::span<const AttributeInstanceSyntax* const> attributes,
                    bitmask<InstanceFlags> flags, const SyntaxNode* overrideSyntax) :
        netType(context.scope->getDefaultNetType()), comp(context.getCompilation()),
        context(context), parentOverrideNode(parentOverrideNode), overrideSyntax(overrideSyntax),
        implicitNets(implicitNets), attributes(attributes), flags(flags) {}